

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::build_extended_vector_type
          (CompilerMSL *this,uint32_t type_id,uint32_t components,BaseType basetype)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  bool local_69;
  TypedID<(spirv_cross::Types)1> local_60;
  uint32_t local_5c;
  TypedID<(spirv_cross::Types)1> local_58;
  uint32_t ptr_type_id;
  TypedID<(spirv_cross::Types)1> local_50;
  uint32_t array_type_id;
  SPIRType *local_48;
  SPIRType *type;
  SPIRType *local_38;
  SPIRType *old_array_t;
  SPIRType *old_ptr_t;
  SPIRType *p_old_type;
  uint32_t new_type_id;
  BaseType basetype_local;
  uint32_t components_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  p_old_type._4_4_ = basetype;
  new_type_id = components;
  basetype_local = type_id;
  _components_local = this;
  if (components < 2) {
    __assert_fail("components > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                  ,0x9e2,
                  "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
                 );
  }
  p_old_type._0_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  old_ptr_t = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,basetype_local);
  old_array_t = (SPIRType *)0x0;
  local_38 = (SPIRType *)0x0;
  bVar1 = Compiler::is_pointer((Compiler *)this,old_ptr_t);
  if (bVar1) {
    old_array_t = old_ptr_t;
    old_ptr_t = Compiler::get_pointee_type((Compiler *)this,old_ptr_t);
  }
  bVar1 = Compiler::is_array((Compiler *)this,old_ptr_t);
  if (bVar1) {
    local_38 = old_ptr_t;
    type._4_4_ = (old_ptr_t->parent_type).id;
    old_ptr_t = Compiler::get_type((Compiler *)this,type._4_4_);
  }
  local_48 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType_const&>
                       ((Compiler *)this,(uint32_t)p_old_type,old_ptr_t);
  bVar1 = Compiler::is_scalar((Compiler *)this,local_48);
  local_69 = true;
  if (!bVar1) {
    local_69 = Compiler::is_vector((Compiler *)this,local_48);
  }
  if (local_69 != false) {
    *(undefined4 *)&(local_48->super_IVariant).field_0xc = 0x17;
    local_48->vecsize = new_type_id;
    if (p_old_type._4_4_ != Unknown) {
      local_48->basetype = p_old_type._4_4_;
    }
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&array_type_id,(uint32_t)p_old_type);
    (local_48->super_IVariant).self.id = array_type_id;
    bVar1 = Compiler::is_scalar((Compiler *)this,old_ptr_t);
    if (bVar1) {
      TypedID<(spirv_cross::Types)1>::TypedID(&local_50,&(old_ptr_t->super_IVariant).self);
    }
    else {
      local_50.id = (old_ptr_t->parent_type).id;
    }
    (local_48->parent_type).id = local_50.id;
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_48->parent_type);
    type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    bVar1 = Compiler::is_scalar((Compiler *)this,type_00);
    if (bVar1) {
      SmallVector<unsigned_int,_8UL>::clear(&local_48->array);
      SmallVector<bool,_8UL>::clear(&local_48->array_size_literal);
      local_48->pointer = false;
      if (local_38 != (SPIRType *)0x0) {
        ptr_type_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        local_48 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                             ((Compiler *)this,ptr_type_id,local_48);
        *(undefined4 *)&(local_48->super_IVariant).field_0xc = 0x1c;
        TypedID<(spirv_cross::Types)1>::TypedID(&local_58,(uint32_t)p_old_type);
        (local_48->parent_type).id = local_58.id;
        SmallVector<unsigned_int,_8UL>::operator=(&local_48->array,&local_38->array);
        SmallVector<bool,_8UL>::operator=
                  (&local_48->array_size_literal,&local_38->array_size_literal);
        p_old_type._0_4_ = ptr_type_id;
      }
      if (old_array_t != (SPIRType *)0x0) {
        local_5c = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
        local_48 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                             ((Compiler *)this,local_5c,local_48);
        *(undefined4 *)&(local_48->super_IVariant).field_0xc = 0x20;
        TypedID<(spirv_cross::Types)1>::TypedID(&local_60,(uint32_t)p_old_type);
        (local_48->parent_type).id = local_60.id;
        local_48->storage = old_array_t->storage;
        local_48->pointer = true;
        local_48->pointer_depth = local_48->pointer_depth + 1;
        p_old_type._0_4_ = local_5c;
      }
      return (uint32_t)p_old_type;
    }
    __assert_fail("is_scalar(get<SPIRType>(type->parent_type))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                  ,0x9fd,
                  "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
                 );
  }
  __assert_fail("is_scalar(*type) || is_vector(*type)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                ,0x9f5,
                "uint32_t spirv_cross::CompilerMSL::build_extended_vector_type(uint32_t, uint32_t, SPIRType::BaseType)"
               );
}

Assistant:

uint32_t CompilerMSL::build_extended_vector_type(uint32_t type_id, uint32_t components, SPIRType::BaseType basetype)
{
	assert(components > 1);
	uint32_t new_type_id = ir.increase_bound_by(1);
	const auto *p_old_type = &get<SPIRType>(type_id);
	const SPIRType *old_ptr_t = nullptr;
	const SPIRType *old_array_t = nullptr;

	if (is_pointer(*p_old_type))
	{
		old_ptr_t = p_old_type;
		p_old_type = &get_pointee_type(*old_ptr_t);
	}

	if (is_array(*p_old_type))
	{
		old_array_t = p_old_type;
		p_old_type = &get_type(old_array_t->parent_type);
	}

	auto *type = &set<SPIRType>(new_type_id, *p_old_type);
	assert(is_scalar(*type) || is_vector(*type));
	type->op = OpTypeVector;
	type->vecsize = components;
	if (basetype != SPIRType::Unknown)
		type->basetype = basetype;
	type->self = new_type_id;
	// We want parent type to point to the scalar type.
	type->parent_type = is_scalar(*p_old_type) ? TypeID(p_old_type->self) : p_old_type->parent_type;
	assert(is_scalar(get<SPIRType>(type->parent_type)));
	type->array.clear();
	type->array_size_literal.clear();
	type->pointer = false;

	if (old_array_t)
	{
		uint32_t array_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(array_type_id, *type);
		type->op = OpTypeArray;
		type->parent_type = new_type_id;
		type->array = old_array_t->array;
		type->array_size_literal = old_array_t->array_size_literal;
		new_type_id = array_type_id;
	}

	if (old_ptr_t)
	{
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		type = &set<SPIRType>(ptr_type_id, *type);
		type->op = OpTypePointer;
		type->parent_type = new_type_id;
		type->storage = old_ptr_t->storage;
		type->pointer = true;
		type->pointer_depth++;
		new_type_id = ptr_type_id;
	}

	return new_type_id;
}